

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_gotoaddressdialog.h
# Opt level: O0

void __thiscall
Ui_GoToAddressDialog::retranslateUi(Ui_GoToAddressDialog *this,QDialog *GoToAddressDialog)

{
  QGroupBox *pQVar1;
  QLabel *pQVar2;
  QString local_70;
  QString local_58;
  QString local_30;
  QDialog *local_18;
  QDialog *GoToAddressDialog_local;
  Ui_GoToAddressDialog *this_local;
  
  local_18 = GoToAddressDialog;
  GoToAddressDialog_local = (QDialog *)this;
  QCoreApplication::translate((char *)&local_30,"GoToAddressDialog","Select item at address",0);
  QWidget::setWindowTitle((QString *)GoToAddressDialog);
  QString::~QString(&local_30);
  pQVar1 = this->groupBox;
  QString::QString(&local_58);
  QGroupBox::setTitle((QString *)pQVar1);
  QString::~QString(&local_58);
  pQVar2 = this->label;
  QCoreApplication::translate((char *)&local_70,"GoToAddressDialog","Select item at address:",0);
  QLabel::setText((QString *)pQVar2);
  QString::~QString(&local_70);
  return;
}

Assistant:

void retranslateUi(QDialog *GoToAddressDialog)
    {
        GoToAddressDialog->setWindowTitle(QCoreApplication::translate("GoToAddressDialog", "Select item at address", nullptr));
        groupBox->setTitle(QString());
        label->setText(QCoreApplication::translate("GoToAddressDialog", "Select item at address:", nullptr));
    }